

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIAggregator.cpp
# Opt level: O3

void __thiscall
adios2::aggregator::MPIAggregator::InitComm(MPIAggregator *this,size_t subStreams,Comm *parentComm)

{
  Comm *this_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Comm CStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = helper::Comm::Rank(parentComm);
  iVar2 = helper::Comm::Size(parentComm);
  uVar3 = (ulong)(long)iVar2 / subStreams;
  uVar6 = (ulong)(long)iVar2 % subStreams;
  uVar4 = (ulong)(int)uVar1;
  uVar5 = uVar3 + 1;
  uVar7 = uVar6 * uVar5;
  if (uVar4 < uVar7) {
    uVar4 = uVar4 / uVar5;
    iVar2 = (int)uVar4 * (int)uVar5;
  }
  else {
    uVar5 = (uVar4 - uVar7) / uVar3;
    uVar4 = uVar6 + uVar5;
    iVar2 = (int)uVar5 * (int)uVar3 + (int)uVar7;
  }
  this->m_SubStreamIndex = uVar4;
  this->m_AggregatorRank = iVar2;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"creating aggregators comm with split at Open","");
  helper::Comm::Split(&CStack_58,(int)parentComm,iVar2,(string *)(ulong)uVar1);
  this_00 = &this->m_Comm;
  helper::Comm::operator=(this_00,&CStack_58);
  helper::Comm::~Comm(&CStack_58);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  iVar2 = helper::Comm::Rank(this_00);
  this->m_Rank = iVar2;
  iVar2 = helper::Comm::Size(this_00);
  this->m_Size = iVar2;
  if (this->m_Rank != 0) {
    this->m_IsAggregator = false;
  }
  this->m_IsActive = true;
  this->m_SubStreams = subStreams;
  return;
}

Assistant:

void MPIAggregator::InitComm(const size_t subStreams, helper::Comm const &parentComm)
{
    int parentRank = parentComm.Rank();
    int parentSize = parentComm.Size();

    const size_t process = static_cast<size_t>(parentRank);
    const size_t processes = static_cast<size_t>(parentSize);

    // Divide the processes into S=subStreams groups.
    const size_t q = processes / subStreams;
    const size_t r = processes % subStreams;

    // Groups [0,r) have size q+1.  Groups [r,S) have size q.
    const size_t firstInSmallGroups = r * (q + 1);

    // Within each group the first process becomes its consumer.
    if (process >= firstInSmallGroups)
    {
        m_SubStreamIndex = r + (process - firstInSmallGroups) / q;
        m_AggregatorRank = static_cast<int>(firstInSmallGroups + (m_SubStreamIndex - r) * q);
    }
    else
    {
        m_SubStreamIndex = process / (q + 1);
        m_AggregatorRank = static_cast<int>(m_SubStreamIndex * (q + 1));
    }

    m_Comm = parentComm.Split(m_AggregatorRank, parentRank,
                              "creating aggregators comm with split at Open");

    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();

    if (m_Rank != 0)
    {
        m_IsAggregator = false;
    }

    m_IsActive = true;
    m_SubStreams = subStreams;
}